

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_DISABLED_EnsureNonQuadraticTopNXorSeedByProbeSeqLength_Test::
~Table_DISABLED_EnsureNonQuadraticTopNXorSeedByProbeSeqLength_Test
          (Table_DISABLED_EnsureNonQuadraticTopNXorSeedByProbeSeqLength_Test *this)

{
  Table_DISABLED_EnsureNonQuadraticTopNXorSeedByProbeSeqLength_Test *this_local;
  
  ~Table_DISABLED_EnsureNonQuadraticTopNXorSeedByProbeSeqLength_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, DISABLED_EnsureNonQuadraticTopNXorSeedByProbeSeqLength) {
  ProbeStatsPerSize stats;
  std::vector<size_t> sizes = {Group::kWidth << 5, Group::kWidth << 10};
  for (size_t size : sizes) {
    stats[size] =
        CollectProbeStatsOnKeysXoredWithSeed(CollectBadMergeKeys(size), 200);
  }
  auto expected = XorSeedExpectedStats();
  for (size_t size : sizes) {
    auto& stat = stats[size];
    VerifyStats(size, expected, stat);
  }
}